

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.cpp
# Opt level: O3

void __thiscall wasm::Options::parse(Options *this,int argc,char **argv)

{
  string *this_00;
  Arguments AVar1;
  pointer pOVar2;
  char *__s;
  undefined8 __s2;
  _Alloc_hider __n;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  pointer pcVar6;
  pointer pOVar7;
  Option *o;
  pointer pOVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  Options *local_a8 [2];
  undefined1 local_98 [40];
  undefined1 local_70 [8];
  string argument;
  string currentOption;
  
  if (argc < 1) {
    __assert_fail("argc > 0 && \"expect at least program name as an argument\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp"
                  ,0xc0,"void wasm::Options::parse(int, const char **)");
  }
  if (argc != 1) {
    p_Var10 = (_Base_ptr)(ulong)(uint)argc;
    local_98._32_8_ = (_Base_ptr)0x1;
    local_98._16_8_ = 0;
    local_98._24_8_ = p_Var10;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(argument.field_2._M_local_buf + 8),argv[local_98._32_8_],
                 (allocator<char> *)local_70);
      if (currentOption._M_dataplus._M_p == (pointer)0x0) {
LAB_00c272d6:
        switch(this->positional) {
        case Zero:
        case Optional:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unexpected positional argument \'",0x20);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)argument.field_2._8_8_,
                              (long)currentOption._M_dataplus._M_p);
          std::operator<<(poVar5,"\'\n");
LAB_00c2747c:
          exit(1);
        case One:
          if (local_98._16_8_ != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unexpected second positional argument \'",0x27);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)argument.field_2._8_8_,
                                (long)currentOption._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' for ",6);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(this->positionalName)._M_dataplus._M_p,
                                (this->positionalName)._M_string_length);
            std::operator<<(poVar5,'\n');
            goto LAB_00c2747c;
          }
        case N:
          local_70 = (undefined1  [8])this;
          if ((this->positionalAction).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->positionalAction)._M_invoker)
                    ((_Any_data *)&this->positionalAction,(Options **)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&argument.field_2 + 8));
          local_98._16_8_ = local_98._16_8_ + 1;
        }
      }
      else {
        pcVar6 = (pointer)0x0;
        do {
          if (pcVar6[argument.field_2._8_8_] != '-') {
            if (pcVar6 == (pointer)0x0) goto LAB_00c272d6;
            break;
          }
          pcVar6 = pcVar6 + 1;
        } while (currentOption._M_dataplus._M_p != pcVar6);
        iVar3 = std::__cxx11::string::compare(argument.field_2._M_local_buf + 8);
        if (iVar3 == 0) goto LAB_00c272d6;
        argument._M_dataplus._M_p = (pointer)0x0;
        argument._M_string_length._0_1_ = 0;
        this_00 = (string *)(&argument.field_2._M_allocated_capacity + 1);
        local_70 = (undefined1  [8])&argument._M_string_length;
        lVar4 = std::__cxx11::string::find((char)this_00,0x3d);
        if (lVar4 != -1) {
          std::__cxx11::string::substr((ulong)local_a8,(ulong)this_00);
          std::__cxx11::string::operator=((string *)local_70,(string *)local_a8);
          if (local_a8[0] != (Options *)local_98) {
            operator_delete(local_a8[0],local_98._0_8_ + 1);
          }
          std::__cxx11::string::substr((ulong)local_a8,(ulong)this_00);
          std::__cxx11::string::operator=(this_00,(string *)local_a8);
          if (local_a8[0] != (Options *)local_98) {
            operator_delete(local_a8[0],local_98._0_8_ + 1);
          }
        }
        __n._M_p = currentOption._M_dataplus._M_p;
        __s2 = argument.field_2._8_8_;
        pOVar8 = (this->options).
                 super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pOVar2 = (this->options).
                 super__Vector_base<wasm::Options::Option,_std::allocator<wasm::Options::Option>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pOVar8 == pOVar2) {
LAB_00c27404:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown option \'",0x10);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)argument.field_2._8_8_,
                              (long)currentOption._M_dataplus._M_p);
          std::operator<<(poVar5,"\'\n");
          goto LAB_00c2747c;
        }
        pOVar7 = (pointer)0x0;
        do {
          if ((((pointer)(pOVar8->longName)._M_string_length == __n._M_p) &&
              ((__n._M_p == (pointer)0x0 ||
               (iVar3 = bcmp((pOVar8->longName)._M_dataplus._M_p,(void *)__s2,(size_t)__n._M_p),
               iVar3 == 0)))) ||
             (((pointer)(pOVar8->shortName)._M_string_length == __n._M_p &&
              ((__n._M_p == (pointer)0x0 ||
               (iVar3 = bcmp((pOVar8->shortName)._M_dataplus._M_p,(void *)__s2,(size_t)__n._M_p),
               iVar3 == 0)))))) {
            pOVar7 = pOVar8;
          }
          pOVar8 = pOVar8 + 1;
        } while (pOVar8 != pOVar2);
        if (pOVar7 == (pointer)0x0) goto LAB_00c27404;
        AVar1 = pOVar7->arguments;
        p_Var9 = (_Base_ptr)local_98._32_8_;
        if (AVar1 == N) {
LAB_00c2733e:
          if (argument._M_dataplus._M_p == (pointer)0x0) {
            p_Var9 = (_Base_ptr)((long)(_Rb_tree_color *)local_98._32_8_ + 1);
            if (p_Var9 == (_Base_ptr)local_98._24_8_) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Couldn\'t find expected argument for \'",0x25);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)argument.field_2._8_8_,
                                  (long)currentOption._M_dataplus._M_p);
              std::operator<<(poVar5,"\'\n");
              goto LAB_00c2747c;
            }
            __s = argv[(long)((long)(_Rb_tree_color *)local_98._32_8_ + 1)];
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)local_70,0,(char *)0x0,(ulong)__s);
          }
        }
        else {
          if (AVar1 == One) {
            if (pOVar7->seen != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unexpected second argument \'",0x1c);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)local_70,
                                  (long)argument._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' for \'",7);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(char *)argument.field_2._8_8_,
                                  (long)currentOption._M_dataplus._M_p);
              std::operator<<(poVar5,"\'\n");
              goto LAB_00c2747c;
            }
            goto LAB_00c2733e;
          }
          if ((AVar1 == Zero) && (argument._M_dataplus._M_p != (pointer)0x0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unexpected argument \'",0x15);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_70,
                                (long)argument._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' for option \'",0xe);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)argument.field_2._8_8_,
                                (long)currentOption._M_dataplus._M_p);
            std::operator<<(poVar5,"\'\n");
            goto LAB_00c2747c;
          }
        }
        p_Var10 = (_Base_ptr)local_98._24_8_;
        local_a8[0] = this;
        if ((pOVar7->action).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(pOVar7->action)._M_invoker)
                  ((_Any_data *)&pOVar7->action,local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
        pOVar7->seen = pOVar7->seen + 1;
        local_98._32_8_ = p_Var9;
        if (local_70 != (undefined1  [8])&argument._M_string_length) {
          operator_delete((void *)local_70,
                          CONCAT71(argument._M_string_length._1_7_,
                                   (undefined1)argument._M_string_length) + 1);
        }
      }
      if ((size_type *)argument.field_2._8_8_ != &currentOption._M_string_length) {
        operator_delete((void *)argument.field_2._8_8_,currentOption._M_string_length + 1);
      }
      local_98._32_8_ = (long)(_Rb_tree_color *)local_98._32_8_ + 1;
    } while ((_Base_ptr)local_98._32_8_ != p_Var10);
  }
  return;
}

Assistant:

void Options::parse(int argc, const char* argv[]) {

// On Windows, get the wide char version of the command line flags, and convert
// each one to std::string with UTF-8 manually. This means that all paths in
// Binaryen are stored this way on all platforms right up until a library call
// is made to open a file (at which point we use Path::to_path to convert back)
// so that it works with the underlying Win32 APIs.
// Only argList (and not argv) should be used below.
#ifdef USE_WSTRING_PATHS
  LPWSTR* argListW = CommandLineToArgvW(GetCommandLineW(), &argc);
  std::vector<std::string> argList;
  for (size_t i = 0, e = argc; i < e; ++i) {
    argList.push_back(wasm::Path::wstring_to_string(argListW[i]));
  }
#else
  const char** argList = argv;
#endif

  assert(argc > 0 && "expect at least program name as an argument");
  size_t positionalsSeen = 0;
  auto dashes = [](const std::string& s) {
    for (size_t i = 0; i < s.size(); ++i) {
      if (s[i] != '-') {
        return i;
      }
    }
    return s.size();
  };
  for (size_t i = 1, e = argc; i != e; ++i) {
    std::string currentOption = argList[i];

    // "-" alone is a positional option
    if (dashes(currentOption) == 0 || currentOption == "-") {
      // Positional.
      switch (positional) {
        case Arguments::Zero:
          // Optional arguments must use --flag=A format, and not separated by
          // spaces (which would be ambiguous).
        case Arguments::Optional:
          std::cerr << "Unexpected positional argument '" << currentOption
                    << "'\n";
          exit(EXIT_FAILURE);
        case Arguments::One:
          if (positionalsSeen) {
            std::cerr << "Unexpected second positional argument '"
                      << currentOption << "' for " << positionalName << '\n';
            exit(EXIT_FAILURE);
          }
          [[fallthrough]];
        case Arguments::N:
          positionalAction(this, currentOption);
          ++positionalsSeen;
          break;
      }
      continue;
    }

    // Non-positional.
    std::string argument;
    auto equal = currentOption.find_first_of('=');
    if (equal != std::string::npos) {
      argument = currentOption.substr(equal + 1);
      currentOption = currentOption.substr(0, equal);
    }
    Option* option = nullptr;
    for (auto& o : options) {
      if (o.longName == currentOption || o.shortName == currentOption) {
        option = &o;
      }
    }
    if (!option) {
      std::cerr << "Unknown option '" << currentOption << "'\n";
      exit(EXIT_FAILURE);
    }
    switch (option->arguments) {
      case Arguments::Zero:
        if (argument.size()) {
          std::cerr << "Unexpected argument '" << argument << "' for option '"
                    << currentOption << "'\n";
          exit(EXIT_FAILURE);
        }
        break;
      case Arguments::One:
        if (option->seen) {
          std::cerr << "Unexpected second argument '" << argument << "' for '"
                    << currentOption << "'\n";
          exit(EXIT_FAILURE);
        }
        [[fallthrough]];
      case Arguments::N:
        if (!argument.size()) {
          if (i + 1 == e) {
            std::cerr << "Couldn't find expected argument for '"
                      << currentOption << "'\n";
            exit(EXIT_FAILURE);
          }
          argument = argList[++i];
        }
        break;
      case Arguments::Optional:
        break;
    }
    option->action(this, argument);
    ++option->seen;
  }
}